

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg,ImGuiItemFlags extra_flags)

{
  short *psVar1;
  ImGuiItemStatusFlags *pIVar2;
  int *piVar3;
  ImRect *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImGuiNavLayer IVar10;
  uint uVar11;
  int iVar12;
  ImGuiWindow *window_00;
  ImGuiWindow *pIVar13;
  float fVar14;
  ImGuiContext *pIVar15;
  bool bVar16;
  bool bVar17;
  uint uVar18;
  ImGuiID id_1;
  ImGuiNavItemData *pIVar19;
  ImGuiContext *g;
  ImGuiWindow *window;
  float fVar20;
  ImVec2 IVar21;
  ImVec2 IVar22;
  
  pIVar15 = GImGui;
  window_00 = GImGui->CurrentWindow;
  (GImGui->LastItemData).ID = id;
  IVar21 = bb->Max;
  (pIVar15->LastItemData).Rect.Min = bb->Min;
  (pIVar15->LastItemData).Rect.Max = IVar21;
  if (nav_bb_arg == (ImRect *)0x0) {
    nav_bb_arg = bb;
  }
  IVar21 = nav_bb_arg->Max;
  (pIVar15->LastItemData).NavRect.Min = nav_bb_arg->Min;
  (pIVar15->LastItemData).NavRect.Max = IVar21;
  uVar18 = extra_flags | pIVar15->CurrentItemFlags;
  (pIVar15->LastItemData).InFlags = uVar18;
  (pIVar15->LastItemData).StatusFlags = 0;
  if (id == 0) goto LAB_0013b190;
  if (pIVar15->ActiveId == id) {
    pIVar15->ActiveIdIsAlive = id;
  }
  if (pIVar15->ActiveIdPreviousFrame == id) {
    pIVar15->ActiveIdPreviousFrameIsAlive = true;
  }
  IVar10 = (window_00->DC).NavLayerCurrent;
  psVar1 = &(window_00->DC).NavLayersActiveMaskNext;
  *psVar1 = *psVar1 | (ushort)(1 << ((byte)IVar10 & 0x1f));
  if ((((pIVar15->NavId == id) || (pIVar15->NavAnyRequest == true)) &&
      (pIVar13 = pIVar15->NavWindow, pIVar13->RootWindowForNav == window_00->RootWindowForNav)) &&
     ((window_00 == pIVar13 || (((uint)(pIVar13->Flags | window_00->Flags) >> 0x17 & 1) != 0)))) {
    fVar5 = (pIVar15->LastItemData).NavRect.Min.x;
    fVar6 = (pIVar15->LastItemData).NavRect.Min.y;
    fVar7 = (pIVar15->LastItemData).NavRect.Max.x;
    fVar8 = (pIVar15->LastItemData).NavRect.Max.y;
    if ((pIVar15->NavInitRequest == true) && ((uVar18 & 4) == 0 && IVar10 == pIVar15->NavLayer)) {
      if (((uVar18 & 0x10) == 0) || (pIVar15->NavInitResultId == 0)) {
        pIVar15->NavInitResultId = id;
        fVar20 = (window_00->DC).CursorStartPos.x;
        fVar9 = (window_00->DC).CursorStartPos.y;
        IVar21.x = fVar5 - fVar20;
        IVar21.y = fVar6 - fVar9;
        IVar22.x = fVar7 - fVar20;
        IVar22.y = fVar8 - fVar9;
        (pIVar15->NavInitResultRectRel).Min = IVar21;
        (pIVar15->NavInitResultRectRel).Max = IVar22;
      }
      if ((uVar18 & 0x10) == 0) {
        pIVar15->NavInitRequest = false;
        if (pIVar15->NavMoveScoringItems == false) {
          pIVar15->NavAnyRequest = false;
        }
        else {
          pIVar15->NavAnyRequest = true;
          if (pIVar15->NavWindow == (ImGuiWindow *)0x0) goto LAB_0013b2bf;
        }
      }
    }
    if (pIVar15->NavMoveScoringItems == true) {
      uVar11 = pIVar15->NavMoveFlags;
      if ((uVar11 >> 10 & 1) == 0) {
        if ((uVar18 & 0xc) == 0 && ((uVar11 & 0x10) != 0 || pIVar15->NavId != id)) {
          pIVar19 = &pIVar15->NavMoveResultOther;
          if (window_00 == pIVar15->NavWindow) {
            pIVar19 = &pIVar15->NavMoveResultLocal;
          }
          bVar16 = NavScoreItem(pIVar19);
          if (bVar16) {
            NavApplyItemToResult(pIVar19);
          }
          if (((((pIVar15->NavMoveFlags & 0x20) != 0) &&
               (fVar20 = (window_00->ClipRect).Max.y, fVar6 < fVar20)) &&
              (fVar9 = (window_00->ClipRect).Min.y, fVar9 < fVar8)) &&
             ((fVar5 < (window_00->ClipRect).Max.x &&
              ((window_00->ClipRect).Min.x <= fVar7 && fVar7 != (window_00->ClipRect).Min.x)))) {
            fVar14 = fVar20;
            if (fVar8 <= fVar20) {
              fVar14 = fVar8;
            }
            if (fVar6 <= fVar20) {
              fVar20 = fVar6;
            }
            if ((fVar8 - fVar6) * 0.7 <=
                (float)(-(uint)(fVar8 < fVar9) & (uint)fVar9 |
                       ~-(uint)(fVar8 < fVar9) & (uint)fVar14) -
                (float)(-(uint)(fVar6 < fVar9) & (uint)fVar9 |
                       ~-(uint)(fVar6 < fVar9) & (uint)fVar20)) {
              pIVar19 = &pIVar15->NavMoveResultLocalVisible;
              bVar16 = NavScoreItem(pIVar19);
              if (bVar16) goto LAB_0013b57c;
            }
          }
        }
      }
      else if ((uVar18 & 0x105) == 0x100 || (uVar11 >> 9 & 1) != 0) {
        pIVar19 = &pIVar15->NavMoveResultLocal;
        iVar12 = pIVar15->NavTabbingDir;
        if (iVar12 == -1) {
          if (pIVar15->NavId == id) {
            if ((pIVar15->NavMoveResultLocal).ID != 0) {
              pIVar15->NavMoveScoringItems = false;
              pIVar15->NavAnyRequest = pIVar15->NavInitRequest;
              if ((pIVar15->NavInitRequest == true) && (pIVar15->NavWindow == (ImGuiWindow *)0x0)) {
LAB_0013b2bf:
                __assert_fail("g.NavWindow != __null",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                              ,0x2742,"void ImGui::NavUpdateAnyRequestFlag()");
              }
            }
          }
          else {
LAB_0013b57c:
            NavApplyItemToResult(pIVar19);
          }
        }
        else if (iVar12 == 0) {
          if ((pIVar15->NavTabbingResultFirst).ID == 0) {
            pIVar19 = &pIVar15->NavTabbingResultFirst;
LAB_0013b586:
            NavMoveRequestResolveWithLastItem(pIVar19);
          }
        }
        else if (iVar12 == 1) {
          if ((pIVar15->NavTabbingResultFirst).ID == 0) {
            NavApplyItemToResult(&pIVar15->NavTabbingResultFirst);
          }
          piVar3 = &pIVar15->NavTabbingCounter;
          *piVar3 = *piVar3 + -1;
          if (*piVar3 == 0) goto LAB_0013b586;
          if (pIVar15->NavId == id) {
            pIVar15->NavTabbingCounter = 1;
          }
        }
      }
    }
    if (pIVar15->NavId == id) {
      if (pIVar15->NavWindow != window_00) {
        SetNavWindow(window_00);
      }
      IVar10 = (window_00->DC).NavLayerCurrent;
      pIVar15->NavLayer = IVar10;
      pIVar15->NavFocusScopeId = (window_00->DC).NavFocusScopeIdCurrent;
      pIVar15->NavIdIsAlive = true;
      fVar20 = (window_00->DC).CursorStartPos.x;
      fVar9 = (window_00->DC).CursorStartPos.y;
      pIVar4 = window_00->NavRectRel + IVar10;
      (pIVar4->Min).x = fVar5 - fVar20;
      (pIVar4->Min).y = fVar6 - fVar9;
      (pIVar4->Max).x = fVar7 - fVar20;
      (pIVar4->Max).y = fVar8 - fVar9;
    }
  }
  if (window_00->ID == id) {
    __assert_fail("id != window->ID && \"Cannot have an empty ID at the root of a window. If you need an empty label, use ## and read the FAQ about how the ID Stack works!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x209b,
                  "bool ImGui::ItemAdd(const ImRect &, ImGuiID, const ImRect *, ImGuiItemFlags)");
  }
LAB_0013b190:
  (pIVar15->NextItemData).Flags = 0;
  bVar16 = IsClippedEx(bb,id);
  if ((!bVar16) && (bVar17 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar17)) {
    pIVar2 = &(pIVar15->LastItemData).StatusFlags;
    *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  }
  return !bVar16;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg, ImGuiItemFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Set item data
    // (DisplayRect is left untouched, made valid when ImGuiItemStatusFlags_HasDisplayRect is set)
    g.LastItemData.ID = id;
    g.LastItemData.Rect = bb;
    g.LastItemData.NavRect = nav_bb_arg ? *nav_bb_arg : bb;
    g.LastItemData.InFlags = g.CurrentItemFlags | extra_flags;
    g.LastItemData.StatusFlags = ImGuiItemStatusFlags_None;

    // Directional navigation processing
    if (id != 0)
    {
        KeepAliveID(id);

        // Runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        window->DC.NavLayersActiveMaskNext |= (1 << window->DC.NavLayerCurrent);
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem();

        // [DEBUG] People keep stumbling on this problem and using "" as identifier in the root of a window instead of "##something".
        // Empty identifier are valid and useful in a small amount of cases, but 99.9% of the time you want to use "##something".
        // READ THE FAQ: https://dearimgui.org/faq
        IM_ASSERT(id != window->ID && "Cannot have an empty ID at the root of a window. If you need an empty label, use ## and read the FAQ about how the ID Stack works!");

        // [DEBUG] Item Picker tool, when enabling the "extended" version we perform the check in ItemAdd()
#ifdef IMGUI_DEBUG_TOOL_ITEM_PICKER_EX
        if (id == g.DebugItemPickerBreakId)
        {
            IM_DEBUG_BREAK();
            g.DebugItemPickerBreakId = 0;
        }
#endif
    }
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}